

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcwidth.c
# Opt level: O2

_Bool bisearch(uint ucs,interval *table,int max)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (ucs < table->first) {
    bVar3 = false;
  }
  else {
    iVar2 = 0;
    bVar3 = false;
    if (ucs <= table[(uint)max].last) {
      while (bVar3 = iVar2 <= max, iVar2 <= max) {
        iVar1 = (iVar2 + max) / 2;
        if (table[iVar1].last < ucs) {
          iVar2 = iVar1 + 1;
        }
        else {
          if (table[iVar1].first <= ucs) {
            return bVar3;
          }
          max = iVar1 + -1;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

static bool bisearch(unsigned int ucs, const struct interval *table, int max) {
  int min = 0;
  int mid;

  if (ucs < table[0].first || ucs > table[max].last)
    return false;
  while (max >= min) {
    mid = (min + max) / 2;
    if (ucs > table[mid].last)
      min = mid + 1;
    else if (ucs < table[mid].first)
      max = mid - 1;
    else
      return true;
  }

  return false;
}